

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int net_seqnum_diff(unsigned_long seq1,unsigned_long seq2,unsigned_long maxseq)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int d;
  unsigned_long maxseq_local;
  unsigned_long seq2_local;
  unsigned_long seq1_local;
  
  iVar1 = (int)maxseq;
  iVar2 = (int)seq2;
  iVar3 = (int)seq1;
  if (seq2 < seq1) {
    seq1_local._4_4_ = (iVar2 + iVar1) - iVar3;
    if (maxseq >> 1 <= (ulong)(long)seq1_local._4_4_) {
      seq1_local._4_4_ = seq1_local._4_4_ - iVar1;
    }
  }
  else if (seq2 - seq1 < maxseq >> 1) {
    seq1_local._4_4_ = iVar2 - iVar3;
  }
  else {
    seq1_local._4_4_ = (iVar2 - iVar3) - iVar1;
  }
  return seq1_local._4_4_;
}

Assistant:

int net_seqnum_diff(unsigned long seq1, unsigned long seq2,
                    unsigned long maxseq) {
  if (seq2 >= seq1) {
    if ((seq2 - seq1) < (maxseq / 2))
      return seq2 - seq1;
    else
      return (seq2 - seq1) - maxseq;
  } else {
    int d = seq2 + maxseq - seq1;
    if (d < (maxseq / 2))
      return d;
    else
      return d - maxseq;
  }
}